

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O0

void dFillRHS(trans_t trans,int nrhs,double *x,int ldx,SuperMatrix *A,SuperMatrix *B)

{
  char local_5d;
  int local_5c;
  char transc [1];
  undefined8 uStack_58;
  int ldc;
  double zero;
  double one;
  double *rhs;
  DNformat *Bstore;
  SuperMatrix *B_local;
  SuperMatrix *A_local;
  int ldx_local;
  double *x_local;
  int nrhs_local;
  trans_t trans_local;
  
  uStack_58 = 0;
  local_5c = *B->Store;
  if (trans == NOTRANS) {
    local_5d = 'N';
  }
  else {
    local_5d = 'T';
  }
  sp_dgemm(&local_5d,"N",A->nrow,nrhs,A->ncol,1.0,A,x,ldx,0.0,*(double **)((long)B->Store + 8),
           local_5c);
  return;
}

Assistant:

void
dFillRHS(trans_t trans, int nrhs, double *x, int ldx,
         SuperMatrix *A, SuperMatrix *B)
{
    DNformat *Bstore;
    double   *rhs;
    double one = 1.0;
    double zero = 0.0;
    int      ldc;
    char transc[1];

    //Astore = A->Store;
    //Aval   = (double *) Astore->nzval;
    Bstore = B->Store;
    rhs    = Bstore->nzval;
    ldc    = Bstore->lda;
    
    if ( trans == NOTRANS ) *(unsigned char *)transc = 'N';
    else *(unsigned char *)transc = 'T';

    sp_dgemm(transc, "N", A->nrow, nrhs, A->ncol, one, A,
	     x, ldx, zero, rhs, ldc);

}